

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::Desc::reSize(Desc *this,int rowDim,int colDim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Status *pSVar4;
  int in_EDX;
  int in_ESI;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *in_RDI;
  int i_1;
  int i;
  int noldcols;
  int noldrows;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::size(in_RDI);
  iVar2 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::size(in_RDI + 1);
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::reSize
            ((DataArray<soplex::SPxBasisBase<double>::Desc::Status> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar3);
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::reSize
            ((DataArray<soplex::SPxBasisBase<double>::Desc::Status> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar3);
  for (iVar3 = in_ESI + -1; iVar1 <= iVar3; iVar3 = iVar3 + -1) {
    pSVar4 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[](in_RDI,iVar3);
    *pSVar4 = D_UNDEFINED;
  }
  for (iVar1 = in_EDX + -1; iVar2 <= iVar1; iVar1 = iVar1 + -1) {
    pSVar4 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[](in_RDI + 1,iVar1);
    *pSVar4 = D_UNDEFINED;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::Desc::reSize(int rowDim, int colDim)
{

   assert(rowDim >= 0);
   assert(colDim >= 0);

   int noldrows = rowstat.size();
   int noldcols = colstat.size();

   rowstat.reSize(rowDim);
   colstat.reSize(colDim);

   for(int i = rowDim - 1; i >= noldrows; i--)
      rowstat[i] = D_UNDEFINED;

   for(int i = colDim - 1; i >= noldcols; i--)
      colstat[i] = D_UNDEFINED;
}